

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

int strarray_cmp(strarray *a1,strarray *a2)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong __n;
  int iVar4;
  
  if ((a1 == (strarray *)0x0) || (a1->value == (char *)0x0)) {
    iVar4 = 0;
    if (a2 != (strarray *)0x0) {
      iVar4 = -(uint)(a2->value != (char *)0x0);
    }
  }
  else {
    iVar4 = 1;
    if ((a2 != (strarray *)0x0) && (a2->value != (char *)0x0)) {
      uVar1 = a1->length;
      uVar2 = a2->length;
      __n = uVar2;
      if (uVar1 < uVar2) {
        __n = uVar1;
      }
      iVar3 = memcmp(a1->value,a2->value,__n);
      if ((iVar3 != 0) || ((uVar1 <= uVar2 && (iVar4 = -1, uVar2 <= uVar1)))) {
        iVar4 = iVar3;
      }
    }
  }
  return iVar4;
}

Assistant:

int
strarray_cmp(const struct strarray *a1, const struct strarray *a2) {
  int result;
  size_t min_len;

  if (a1 == NULL || a1->value == NULL) {
    return (a2 == NULL || a2->value == NULL) ? 0 : -1;
  }
  if (a2 == NULL || a2->value == NULL) {
    return 1;
  }

  if (a1->length > a2->length) {
    min_len = a2->length;
  }
  else {
    min_len = a1->length;
  }

  result = memcmp(a1->value, a2->value, min_len);
  if (result == 0) {
    if (a1->length > a2->length) {
      return 1;
    }
    if (a1->length < a2->length) {
      return -1;
    }
  }
  return result;
}